

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzDDD::ArchiveIN(ChNodeFEAxyzDDD *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzDDD>(marchive);
  ChNodeFEAxyzDD::ArchiveIN(&this->super_ChNodeFEAxyzDD,marchive);
  local_30._value = (ChVector<double> *)&(this->super_ChNodeFEAxyzDD).field_0x190;
  local_30._name = "DDD";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->DDD_dt;
  local_48._name = "DDD_dt";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->DDD_dtdt;
  local_60._name = "DDD_dtdt";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version = */ marchive.VersionRead<ChNodeFEAxyzDDD>();
    // deserialize parent class
    ChNodeFEAxyzDD::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(DDD);
    marchive >> CHNVP(DDD_dt);
    marchive >> CHNVP(DDD_dtdt);
}